

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::class_<kratos::Port,_std::shared_ptr<kratos::Port>,_kratos::Var>::
     init_holder<kratos::Var>
               (instance *inst,value_and_holder *v_h,holder_type *param_3,
               enable_shared_from_this<kratos::Var> *param_4)

{
  void **ppvVar1;
  element_type *peVar2;
  bool bVar3;
  enable_shared_from_this<kratos::Var> *holder_value_ptr;
  detail local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined1 local_38 [8];
  shared_ptr<kratos::Port> sh;
  
  holder_value_ptr = (enable_shared_from_this<kratos::Var> *)((long)*v_h->vh + 0x68);
  if (*v_h->vh == (void *)0x0) {
    holder_value_ptr = (enable_shared_from_this<kratos::Var> *)0x0;
  }
  pybind11::detail::try_get_shared_from_this<kratos::Var>(local_48,holder_value_ptr);
  std::dynamic_pointer_cast<kratos::Port,kratos::Var>((shared_ptr<kratos::Var> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  peVar2 = sh.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_38 != (undefined1  [8])0x0) {
    ppvVar1 = v_h->vh;
    ppvVar1[1] = (void *)local_38;
    sh.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    ppvVar1[2] = peVar2;
    local_38 = (undefined1  [8])0x0;
    pybind11::detail::value_and_holder::set_holder_constructed(v_h,true);
  }
  bVar3 = pybind11::detail::value_and_holder::holder_constructed(v_h);
  if ((!bVar3) && ((inst->field_0x30 & 1) != 0)) {
    std::__shared_ptr<kratos::Port,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Port,void>
              ((__shared_ptr<kratos::Port,(__gnu_cxx::_Lock_policy)2> *)(v_h->vh + 1),
               (Port *)*v_h->vh);
    pybind11::detail::value_and_holder::set_holder_constructed(v_h,true);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sh);
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type * /* unused */, const std::enable_shared_from_this<T> * /* dummy */) {

        auto sh = std::dynamic_pointer_cast<typename holder_type::element_type>(
                detail::try_get_shared_from_this(v_h.value_ptr<type>()));
        if (sh) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(std::move(sh));
            v_h.set_holder_constructed();
        }

        if (!v_h.holder_constructed() && inst->owned) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }